

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *
tinyusdz::lerp<tinyusdz::value::color4h>
          (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *a,
          vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *b,double t)

{
  ulong uVar1;
  color4h cVar2;
  ulong __new_size;
  long lVar3;
  bool bVar4;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (long)(a->
                super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar1 <= __new_size) {
    __new_size = uVar1;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      while (bVar4 = __new_size != 0, __new_size = __new_size - 1, bVar4) {
        cVar2 = lerp<tinyusdz::value::color4h>
                          ((color4h *)
                           ((long)&(((a->
                                     super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->r).value + lVar3),
                           (color4h *)
                           ((long)&(((b->
                                     super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->r).value + lVar3),
                           t);
        *(color4h *)
         ((long)&(((__return_storage_ptr__->
                   super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                   )._M_impl.super__Vector_impl_data._M_start)->r).value + lVar3) = cVar2;
        lVar3 = lVar3 + 8;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}